

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void analogies(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  size_type sVar1;
  invalid_argument *this;
  const_reference pvVar2;
  ostream *this_00;
  ostream *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string wordC;
  string wordB;
  string wordA;
  string prompt;
  string model;
  string *in_stack_000000d8;
  FastText *in_stack_000000e0;
  FastText fasttext;
  int32_t k;
  size_t *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffe68;
  string local_170 [16];
  FastText *in_stack_fffffffffffffea0;
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [160];
  string *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffd4;
  FastText *in_stack_ffffffffffffffd8;
  int local_c;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar1 == 3) {
    local_c = 10;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar1 != 4) {
      printAnalogiesUsage();
      exit(1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,3);
    local_c = std::__cxx11::stoi(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,0);
  }
  if (local_c < 1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"k needs to be 1 or higher!");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ::fasttext::FastText::FastText(in_stack_fffffffffffffea0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_e8,(string *)pvVar2);
  this_00 = std::operator<<((ostream *)&std::cout,"Loading model ");
  this_01 = std::operator<<(this_00,local_e8);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  ::fasttext::FastText::loadModel(in_stack_000000e0,in_stack_000000d8);
  paVar3 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"Query triplet (A - B + C)? ",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::string(local_130);
  std::__cxx11::string::string(local_150);
  std::__cxx11::string::string(local_170);
  std::operator<<((ostream *)&std::cout,local_108);
  do {
    std::operator>>((istream *)&std::cin,local_130);
    std::operator>>((istream *)&std::cin,local_150);
    std::operator>>((istream *)&std::cin,local_170);
    ::fasttext::FastText::getAnalogies
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    printPredictions((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_RDI,SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffe68 >> 0x30,0));
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00);
    std::operator<<((ostream *)&std::cout,local_108);
  } while( true );
}

Assistant:

void analogies(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printAnalogiesUsage();
    exit(EXIT_FAILURE);
  }
  if (k <= 0) {
    throw std::invalid_argument("k needs to be 1 or higher!");
  }
  FastText fasttext;
  std::string model(args[2]);
  std::cout << "Loading model " << model << std::endl;
  fasttext.loadModel(model);

  std::string prompt("Query triplet (A - B + C)? ");
  std::string wordA, wordB, wordC;
  std::cout << prompt;
  while (true) {
    std::cin >> wordA;
    std::cin >> wordB;
    std::cin >> wordC;
    printPredictions(fasttext.getAnalogies(k, wordA, wordB, wordC), true, true);

    std::cout << prompt;
  }
  exit(0);
}